

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForcesContIntPreInt
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> QiReshapedLiu;
  Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_> PI1;
  Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  undefined1 local_49b8 [16];
  Rhs local_49a8;
  Matrix3xN *local_4998;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>,_Eigen::Matrix<double,_3,_32,_1,_3,_32>,_0>_>
  *local_4990 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
  local_4980 [19];
  Matrix3xN local_4680;
  Matrix3xN local_4380;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>,_Eigen::Matrix<double,_3,_32,_1,_3,_32>,_0>_>
  local_4080 [16];
  double local_4070;
  non_const_type local_4068;
  Matrix3xN *local_4058;
  PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>> local_2080 [8272];
  
  local_49b8._8_8_ = local_49b8._0_8_;
  CalcCoordMatrix(this,&local_4680);
  CalcCoordDerivMatrix(this,&local_4380);
  local_49a8._0_8_ = 0x3fe0000000000000;
  local_4990[0] =
       (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>,_Eigen::Matrix<double,_3,_32,_1,_3,_32>,_0>_>
        *)&local_4680;
  Eigen::operator*(local_4980,(double *)&local_49a8,(StorageBaseType *)local_4990);
  local_4070 = local_4980[0].m_lhs.m_functor.m_other;
  local_4068 = local_4980[0].m_rhs.m_matrix;
  local_4058 = &local_4680;
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,32,1,32,32>>::
  _set_noalias<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,3,0,32,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>const>,Eigen::Matrix<double,3,32,1,3,32>,0>>
            (local_2080,local_4080);
  if (this->m_damping_enabled == true) {
    local_49a8._0_8_ = &local_4380;
    Eigen::operator*(local_4980,&this->m_Alpha,(StorageBaseType *)&local_49a8);
    local_4058 = &local_4680;
    local_4070 = local_4980[0].m_lhs.m_functor.m_other;
    local_4068 = local_4980[0].m_rhs.m_matrix;
    Eigen::MatrixBase<Eigen::Matrix<double,32,32,1,32,32>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,32,1,32,32>> *)local_2080,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>,_Eigen::Matrix<double,_3,_32,_1,_3,_32>,_0>_>
                *)local_4080);
  }
  local_49a8._0_8_ = local_2080;
  local_4990[0] = local_4080;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_4980,&this->m_O1,&local_49a8);
  local_49b8._0_8_ = (StorageBaseType *)local_4990;
  Eigen::
  NoAlias<Eigen::Map<Eigen::Matrix<double,1024,1,0,1024,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
  ::operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,1024,1,0,1024,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
               *)local_49b8,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
               *)local_4980);
  Eigen::MatrixBase<Eigen::Matrix<double,32,32,1,32,32>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_4980,(MatrixBase<Eigen::Matrix<double,32,32,1,32,32>> *)local_4080,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K3Compact);
  local_49b8._0_8_ = &this->m_K13Compact;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)local_49b8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_4980);
  local_4998 = &local_4680;
  local_49b8 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->m_K13Compact,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_> *)
                          &local_4998);
  Eigen::PlainObjectBase<Eigen::Matrix<double,32,3,1,32,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,32,3,1,32,3>> *)local_4980,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>,_0>_>
              *)local_49b8);
  local_49b8._0_8_ = local_4980;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,96,1,0,96,1>,0,Eigen::Stride<0,0>>>
            (Fi,(Map<Eigen::Matrix<double,_96,_1,_0,_96,_1>,_0,_Eigen::Stride<0,_0>_> *)local_49b8);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  For this method, the in-simulation calculations are independent of
    // the number of Gauss quadrature points used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}